

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlocale.cpp
# Opt level: O3

QString * QtTimeZoneLocale::zoneOffsetFormat
                    (QString *__return_storage_ptr__,QLocale *locale,qsizetype param_2,
                    FormatType width,QDateTime *when,int offsetSeconds)

{
  QLocalePrivate *pQVar1;
  QArrayData *data;
  char16_t *pcVar2;
  qsizetype qVar3;
  long in_FS_OFFSET;
  QString local_58;
  QDateTime local_38;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  (__return_storage_ptr__->d).size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  (__return_storage_ptr__->d).ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  systemData(&QLocale::system::locale.m_index);
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._1_3_ = 0;
  QLocale::system::locale.m_numberOptions.super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
  super_QFlagsStorage<QLocale::NumberOption>.i._0_1_ =
       (QLocale::system::locale.m_data)->m_language_id == 1;
  QLocale::QLocale((QLocale *)&local_58,&QLocale::system::locale);
  pQVar1 = (locale->d).d.ptr;
  if ((pQVar1->m_data == *(QLocaleData **)local_58.d.d) &&
     ((pQVar1->m_numberOptions).super_QFlagsStorageHelper<QLocale::NumberOption,_4>.
      super_QFlagsStorage<QLocale::NumberOption>.i == (Int)local_58.d.d[1].super_QArrayData.alloc))
  {
    QDateTime::toOffsetFromUtc(&local_38,(int)when);
    QDateTime::timeZoneAbbreviation(__return_storage_ptr__,&local_38);
    QDateTime::~QDateTime(&local_38);
  }
  else {
    QDateTime::timeRepresentation(&local_38);
    QTimeZone::displayName(__return_storage_ptr__,(QTimeZone *)&local_38,when,OffsetName,locale);
    QTimeZone::~QTimeZone((QTimeZone *)&local_38);
  }
  QLocale::~QLocale((QLocale *)&local_58);
  if ((__return_storage_ptr__->d).size != 0) {
    offsetFromAbbreviation(&local_58,__return_storage_ptr__);
    data = &((__return_storage_ptr__->d).d)->super_QArrayData;
    pcVar2 = (__return_storage_ptr__->d).ptr;
    (__return_storage_ptr__->d).d = local_58.d.d;
    (__return_storage_ptr__->d).ptr = local_58.d.ptr;
    qVar3 = (__return_storage_ptr__->d).size;
    (__return_storage_ptr__->d).size = local_58.d.size;
    local_58.d.d = (Data *)data;
    local_58.d.ptr = pcVar2;
    local_58.d.size = qVar3;
    if (data != (QArrayData *)0x0) {
      LOCK();
      (data->ref_)._q_value.super___atomic_base<int>._M_i =
           (data->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((data->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(data,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QString zoneOffsetFormat([[maybe_unused]] const QLocale &locale,
                         qsizetype,
                         [[maybe_unused]] QLocale::FormatType width,
                         const QDateTime &when,
                         int offsetSeconds)
{
    // Only the non-ICU TZ-locale code uses the other two widths:
    Q_ASSERT(width == QLocale::ShortFormat); //
    QString text =
#if QT_CONFIG(timezone)
        locale != QLocale::system()
        ? when.timeRepresentation().displayName(when, QTimeZone::OffsetName, locale)
        :
#endif
        when.toOffsetFromUtc(offsetSeconds).timeZoneAbbreviation();

    if (!text.isEmpty())
        text = offsetFromAbbreviation(std::move(text));
    // else: no suitable representation of the zone.
    return text;
}